

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

char * fmt::v6::internal::
       parse_align<char,fmt::v6::internal::specs_checker<fmt::v6::internal::dynamic_specs_handler<fmt::v6::basic_format_parse_context<char,fmt::v6::internal::error_handler>>>&>
                 (char *begin,char *end,
                 specs_checker<fmt::v6::internal::dynamic_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>_>_>
                 *handler)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  align_t align;
  char *pcVar4;
  
  pcVar4 = begin + 1;
  uVar3 = (ulong)(pcVar4 != end);
  do {
    bVar1 = begin[uVar3];
    align = none;
    bVar2 = true;
    if (bVar1 < 0x3e) {
      if (bVar1 == 0x3c) {
        align = left;
        goto LAB_00161e93;
      }
      if (bVar1 == 0x3d) {
        align = numeric;
        goto LAB_00161e93;
      }
    }
    else {
      if (bVar1 == 0x3e) {
        align = right;
      }
      else {
        if (bVar1 != 0x5e) goto LAB_00161e95;
        align = center;
      }
LAB_00161e93:
      bVar2 = false;
    }
LAB_00161e95:
    if (!bVar2) {
      if (0 < (long)uVar3) {
        if (*begin == '{') {
          error_handler::on_error
                    ((error_handler *)
                     (handler->
                     super_dynamic_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>_>
                     ).context_,"invalid fill character \'{\'");
        }
        pcVar4 = begin + 2;
        (((handler->
          super_dynamic_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>_>
          ).super_specs_setter<char>.specs_)->fill).data_[0] = *begin;
      }
      specs_checker<fmt::v6::internal::dynamic_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>_>_>
      ::on_align(handler,align);
      return pcVar4;
    }
    bVar2 = (long)uVar3 < 1;
    uVar3 = uVar3 - 1;
    if (bVar2) {
      return begin;
    }
  } while( true );
}

Assistant:

FMT_CONSTEXPR const Char* parse_align(const Char* begin, const Char* end,
                                      Handler&& handler) {
  FMT_ASSERT(begin != end, "");
  auto align = align::none;
  int i = 0;
  if (begin + 1 != end) ++i;
  do {
    switch (static_cast<char>(begin[i])) {
    case '<':
      align = align::left;
      break;
    case '>':
      align = align::right;
      break;
#if FMT_NUMERIC_ALIGN
    case '=':
      align = align::numeric;
      break;
#endif
    case '^':
      align = align::center;
      break;
    }
    if (align != align::none) {
      if (i > 0) {
        auto c = *begin;
        if (c == '{')
          return handler.on_error("invalid fill character '{'"), begin;
        begin += 2;
        handler.on_fill(c);
      } else
        ++begin;
      handler.on_align(align);
      break;
    }
  } while (i-- > 0);
  return begin;
}